

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRDisplayNode::createChildren
          (VRDisplayNode *this,VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  bool bVar1;
  int iVar2;
  VRDisplayNode *pVVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  long *in_RDI;
  string *unaff_retaddr;
  VRDataIndex *in_stack_00000008;
  VRDisplayNode *child;
  const_iterator it;
  string *in_stack_000000b0;
  VRDataIndex *in_stack_000000b8;
  VRMainInterface *in_stack_000000c0;
  VRFactory *in_stack_000000c8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string validatedNameSpace;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  allocator<char> *in_stack_fffffffffffffee0;
  allocator<char> *__a;
  iterator local_f8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  iterator local_e8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  allocator<char> local_79;
  string local_78 [23];
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  VRDataIndex *in_stack_ffffffffffffffb8;
  string local_40 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  VRDataIndex::validateNameSpace(in_stack_00000008,unaff_retaddr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_18,(char *)in_RDI,in_stack_fffffffffffffee0);
  __a = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_18,(char *)in_RDI,__a);
  std::__cxx11::string::string(local_d8,local_40);
  VRDataIndex::selectByAttribute
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  local_e8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffea8);
  std::
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_List_const_iterator(&local_e0,&local_e8);
  while( true ) {
    local_f8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffea8);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_f0,&local_f8);
    bVar1 = std::operator!=(&local_e0,&local_f0);
    if (!bVar1) break;
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(in_stack_fffffffffffffeb0);
    iVar2 = VRDataIndex::isChild(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (iVar2 == 1) {
      (*(code *)local_10->_M_node[3]._M_prev)();
      in_stack_fffffffffffffeb0 = local_10;
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(local_10);
      pVVar3 = VRFactory::create<MinVR::VRDisplayNode>
                         (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
      if (pVVar3 != (VRDisplayNode *)0x0) {
        (**(code **)(*in_RDI + 0x40))(in_RDI,pVVar3);
      }
    }
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_e0);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x16d8e9);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void VRDisplayNode::createChildren(VRMainInterface *vrMain,
                                   VRDataIndex *config,
                                   const std::string &nameSpace) {

  std::string validatedNameSpace = config->validateNameSpace(nameSpace);

  std::list<std::string> names =
    config->selectByAttribute("displaynodeType", "*", validatedNameSpace, true);

  for (std::list<std::string>::const_iterator it = names.begin();
       it != names.end(); ++it) {

    // We only want to do this for direct children. The grandchildren
    // and their progeny will be addressed in turn.
    if (VRDataIndex::isChild(nameSpace, *it) == 1) {

      VRDisplayNode *child =
        vrMain->getFactory()->create<VRDisplayNode>(vrMain, config, *it);
      if (child != NULL) {
        addChild(child);
      }
    }
  }
}